

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(ct->name).gcptr32;
  if (uVar4 == 0) {
    if (ctr->needsp != 0) {
      pcVar1 = ctr->pb;
      if (ctr->buf < pcVar1) {
        ctr->pb = pcVar1 + -1;
        pcVar1[-1] = ' ';
      }
      else {
        ctr->ok = 0;
      }
    }
    pcVar1 = ctr->pb;
    if (pcVar1 < ctr->buf + 0xb) {
      ctr->ok = 0;
    }
    else {
      uVar4 = (ulong)((long)ct - (long)ctr->cts->tab) >> 4;
      do {
        uVar3 = (uint)uVar4;
        pcVar1[-1] = (char)uVar4 + (char)((uVar4 & 0xffffffff) / 10) * -10 | 0x30;
        pcVar1 = pcVar1 + -1;
        uVar4 = (uVar4 & 0xffffffff) / 10;
      } while (9 < uVar3);
      ctr->pb = pcVar1;
      ctr->needsp = 0;
    }
    ctr->needsp = 1;
  }
  else {
    ctype_prepstr(ctr,(char *)(uVar4 + 0x10),*(MSize *)(uVar4 + 0xc));
  }
  sVar2 = strlen(t);
  ctype_prepstr(ctr,t,(MSize)sVar2);
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}